

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCommand.cxx
# Opt level: O2

bool anon_unknown.dwarf_10f5107::HandleRealPathCommand
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,cmExecutionStatus *status)

{
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_base;
  cmMakefile *this;
  bool bVar1;
  bool bVar2;
  PolicyStatus PVar3;
  int iVar4;
  string *__u;
  PolicyID id;
  value_type *this_00;
  bool bVar5;
  string_view name;
  string_view name_00;
  string_view value;
  value_type input;
  string realPath;
  anon_class_96_1_9c44fff6 computeNewPath;
  string oldPolicyPath;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  unparsedArguments;
  string local_d0;
  Arguments arguments;
  string local_50;
  
  this_00 = &input;
  if ((ulong)((long)(args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish -
             (long)(args->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start) < 0x41) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&computeNewPath,"REAL_PATH requires a path and an output variable",
               (allocator<char> *)&arguments);
    std::__cxx11::string::_M_assign((string *)&status->Error);
    std::__cxx11::string::~string((string *)&computeNewPath);
    return false;
  }
  if (((anonymous_namespace)::
       HandleRealPathCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
       ::parser == '\0') &&
     (iVar4 = __cxa_guard_acquire(&(anonymous_namespace)::
                                   HandleRealPathCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                                   ::parser), iVar4 != 0)) {
    computeNewPath.arguments.BaseDirectory.
    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
    ._M_payload.
    super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ._M_engaged = false;
    computeNewPath.arguments.BaseDirectory.
    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
    ._M_payload.
    super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ._33_7_ = 0;
    computeNewPath.arguments.ExpandTilde = false;
    computeNewPath.arguments._89_7_ = 0;
    computeNewPath.arguments.BaseDirectory.
    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
    ._M_payload.
    super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ._M_payload._16_8_ = 0;
    computeNewPath.arguments.BaseDirectory.
    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
    ._M_payload.
    super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ._M_payload._24_8_ = 0;
    computeNewPath.arguments.BaseDirectory.
    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
    ._M_payload.
    super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ._M_payload._M_value._M_dataplus._M_p = (_Alloc_hider)(pointer)0x0;
    computeNewPath.arguments.BaseDirectory.
    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
    ._M_payload.
    super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ._M_payload._M_value._M_string_length = 0;
    computeNewPath.arguments.super_ParseResult.KeywordErrors._M_t._M_impl.super__Rb_tree_header.
    _M_header._M_right = (_Base_ptr)0x0;
    computeNewPath.arguments.super_ParseResult.KeywordErrors._M_t._M_impl.super__Rb_tree_header.
    _M_node_count = 0;
    computeNewPath.arguments.super_ParseResult.KeywordErrors._M_t._M_impl.super__Rb_tree_header.
    _M_header._M_parent = (_Base_ptr)0x0;
    computeNewPath.arguments.super_ParseResult.KeywordErrors._M_t._M_impl.super__Rb_tree_header.
    _M_header._M_left = (_Base_ptr)0x0;
    computeNewPath.arguments.super_ParseResult.KeywordErrors._M_t._M_impl._0_8_ = 0;
    computeNewPath.arguments.super_ParseResult.KeywordErrors._M_t._M_impl.super__Rb_tree_header.
    _M_header._M_color = _S_red;
    computeNewPath.arguments.super_ParseResult.KeywordErrors._M_t._M_impl.super__Rb_tree_header.
    _M_header._4_4_ = 0;
    arguments.super_ParseResult.KeywordErrors._M_t._M_impl.super__Rb_tree_header._M_header._M_color
         = _S_red;
    arguments.super_ParseResult.KeywordErrors._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0
    ;
    arguments.super_ParseResult.KeywordErrors._M_t._M_impl._0_8_ = 0x30;
    arguments.super_ParseResult.KeywordErrors._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         (_Base_ptr)
         std::
         _Function_handler<void_(ArgumentParser::Instance_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmArgumentParser.h:250:28)>
         ::_M_invoke;
    arguments.super_ParseResult.KeywordErrors._M_t._M_impl.super__Rb_tree_header._M_header._M_parent
         = (_Base_ptr)
           std::
           _Function_handler<void_(ArgumentParser::Instance_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmArgumentParser.h:250:28)>
           ::_M_manager;
    name._M_str = "BASE_DIRECTORY";
    name._M_len = 0xe;
    ArgumentParser::Base::Bind((Base *)&computeNewPath,name,(KeywordAction *)&arguments);
    std::_Function_base::~_Function_base((_Function_base *)&arguments);
    arguments.super_ParseResult.KeywordErrors._M_t._M_impl.super__Rb_tree_header._M_header._M_color
         = _S_red;
    arguments.super_ParseResult.KeywordErrors._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0
    ;
    arguments.super_ParseResult.KeywordErrors._M_t._M_impl._0_8_ = 0x58;
    arguments.super_ParseResult.KeywordErrors._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         (_Base_ptr)
         std::
         _Function_handler<void_(ArgumentParser::Instance_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmArgumentParser.h:250:28)>
         ::_M_invoke;
    arguments.super_ParseResult.KeywordErrors._M_t._M_impl.super__Rb_tree_header._M_header._M_parent
         = (_Base_ptr)
           std::
           _Function_handler<void_(ArgumentParser::Instance_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmArgumentParser.h:250:28)>
           ::_M_manager;
    name_00._M_str = "EXPAND_TILDE";
    name_00._M_len = 0xc;
    ArgumentParser::Base::Bind((Base *)&computeNewPath,name_00,(KeywordAction *)&arguments);
    std::_Function_base::~_Function_base((_Function_base *)&arguments);
    ArgumentParser::ActionMap::ActionMap
              ((ActionMap *)&HandleRealPathCommand::parser,(ActionMap *)&computeNewPath);
    ArgumentParser::ActionMap::~ActionMap((ActionMap *)&computeNewPath);
    __cxa_atexit(ArgumentParser::Base::~Base,&HandleRealPathCommand::parser,&__dso_handle);
    __cxa_guard_release(&(anonymous_namespace)::
                         HandleRealPathCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                         ::parser);
  }
  computeNewPath.arguments.super_ParseResult.KeywordErrors._M_t._M_impl.super__Rb_tree_header.
  _M_header._M_parent = (_Base_ptr)&unparsedArguments;
  unparsedArguments.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  unparsedArguments.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  unparsedArguments.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  input._M_string_length =
       (size_type)
       (args->
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )._M_impl.super__Vector_impl_data._M_finish;
  input._M_dataplus._M_p =
       (pointer)((args->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start + 3);
  arguments.super_ParseResult.KeywordErrors._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &arguments.super_ParseResult.KeywordErrors._M_t._M_impl.super__Rb_tree_header._M_header;
  arguments.super_ParseResult.KeywordErrors._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
       arguments.super_ParseResult.KeywordErrors._M_t._M_impl.super__Rb_tree_header._M_header._0_8_
       & 0xffffffff00000000;
  arguments.super_ParseResult.KeywordErrors._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  arguments.super_ParseResult.KeywordErrors._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  arguments.BaseDirectory.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_engaged = false;
  arguments.ExpandTilde = false;
  computeNewPath.arguments.super_ParseResult.KeywordErrors._M_t._M_impl._0_8_ =
       &HandleRealPathCommand::parser;
  computeNewPath.arguments.super_ParseResult.KeywordErrors._M_t._M_impl.super__Rb_tree_header.
  _M_header._0_8_ = &arguments;
  computeNewPath.arguments.super_ParseResult.KeywordErrors._M_t._M_impl.super__Rb_tree_header.
  _M_header._M_right = (_Base_ptr)0x0;
  computeNewPath.arguments.super_ParseResult.KeywordErrors._M_t._M_impl.super__Rb_tree_header.
  _M_node_count = 0;
  computeNewPath.arguments.BaseDirectory.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_payload._M_value._M_dataplus._M_p = (_Alloc_hider)(pointer)0x0;
  computeNewPath.arguments.BaseDirectory.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_payload._M_value._M_string_length = 0;
  computeNewPath.arguments.BaseDirectory.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_payload._16_8_ = 0;
  computeNewPath.arguments.BaseDirectory.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_payload._24_8_ = 0;
  computeNewPath.arguments.BaseDirectory.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_engaged = false;
  computeNewPath.arguments.BaseDirectory.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._33_7_ = 0;
  computeNewPath.arguments.ExpandTilde = false;
  computeNewPath.arguments._89_7_ = 0;
  computeNewPath.arguments.super_ParseResult.KeywordErrors._M_t._M_impl.super__Rb_tree_header.
  _M_header._M_left =
       (_Base_ptr)
       computeNewPath.arguments.super_ParseResult.KeywordErrors._M_t._M_impl.super__Rb_tree_header.
       _M_header._0_8_;
  arguments.super_ParseResult.KeywordErrors._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       arguments.super_ParseResult.KeywordErrors._M_t._M_impl.super__Rb_tree_header._M_header.
       _M_left;
  ArgumentParser::Instance::
  Parse<cmRange<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>
            ((Instance *)&computeNewPath,
             (cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
              *)&input,0);
  std::_Function_base::~_Function_base
            ((_Function_base *)
             ((long)&computeNewPath.arguments.BaseDirectory.
                     super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                     ._M_payload.
                     super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                     .
                     super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             + 0x10));
  bVar5 = unparsedArguments.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start ==
          unparsedArguments.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish;
  if (bVar5) {
    bVar2 = ArgumentParser::ParseResult::MaybeReportError
                      (&arguments.super_ParseResult,status->Makefile);
    if (bVar2) goto LAB_0039c8d4;
    in_base = &arguments.BaseDirectory;
    if (arguments.BaseDirectory.
        super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
        ._M_payload.
        super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
        .
        super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ._M_engaged == false) {
      __u = cmMakefile::GetCurrentSourceDirectory_abi_cxx11_(status->Makefile);
      std::optional<std::__cxx11::string>::operator=((optional<std::__cxx11::string> *)in_base,__u);
    }
    std::__cxx11::string::string
              ((string *)&input,
               (string *)
               ((args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start + 1));
    if ((((arguments.ExpandTilde == true) && (input._M_string_length != 0)) &&
        (*input._M_dataplus._M_p == '~')) &&
       ((input._M_string_length == 1 || (input._M_dataplus._M_p[1] == '/')))) {
      computeNewPath.arguments.super_ParseResult.KeywordErrors._M_t._M_impl._0_8_ =
           (long)&computeNewPath.arguments.super_ParseResult.KeywordErrors._M_t._M_impl.
                  super__Rb_tree_header + 8;
      computeNewPath.arguments.super_ParseResult.KeywordErrors._M_t._M_impl.super__Rb_tree_header.
      _M_header._M_color = _S_red;
      computeNewPath.arguments.super_ParseResult.KeywordErrors._M_t._M_impl.super__Rb_tree_header.
      _M_header._4_4_ = 0;
      computeNewPath.arguments.super_ParseResult.KeywordErrors._M_t._M_impl.super__Rb_tree_header.
      _M_header._M_parent =
           (_Base_ptr)
           ((ulong)computeNewPath.arguments.super_ParseResult.KeywordErrors._M_t._M_impl.
                   super__Rb_tree_header._M_header._M_parent & 0xffffffffffffff00);
      bVar2 = cmsys::SystemTools::GetEnv("HOME",(string *)&computeNewPath);
      if (bVar2) {
        std::__cxx11::string::replace((ulong)&input,0,(string *)&DAT_00000001);
      }
      std::__cxx11::string::~string((string *)&computeNewPath);
    }
    PVar3 = cmMakefile::GetPolicyStatus(status->Makefile,CMP0152,false);
    if (PVar3 == OLD) {
      bVar2 = false;
LAB_0039c70d:
      bVar1 = false;
    }
    else {
      if (PVar3 == WARN) {
        bVar2 = true;
        goto LAB_0039c70d;
      }
      bVar1 = true;
      bVar2 = false;
    }
    std::
    _Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::_Rb_tree((_Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)&computeNewPath,
               (_Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)&arguments);
    std::
    _Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
    ::_Optional_base(&computeNewPath.arguments.BaseDirectory.
                      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                     ,&in_base->
                       super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                    );
    realPath._M_dataplus._M_p = (pointer)&realPath.field_2;
    realPath._M_string_length = 0;
    computeNewPath.arguments.ExpandTilde = arguments.ExpandTilde;
    realPath.field_2._M_local_buf[0] = '\0';
    if (bVar1) {
      HandleRealPathCommand::anon_class_96_1_9c44fff6::operator()(&computeNewPath,&input,&realPath);
    }
    else {
      cmsys::SystemTools::CollapseFullPath(&oldPolicyPath,&input,(string *)in_base);
      cmsys::SystemTools::GetRealPath(&local_d0,&oldPolicyPath,(string *)0x0);
      std::__cxx11::string::operator=((string *)&oldPolicyPath,(string *)&local_d0);
      std::__cxx11::string::~string((string *)&local_d0);
      if (bVar2) {
        HandleRealPathCommand::anon_class_96_1_9c44fff6::operator()
                  (&computeNewPath,&input,&realPath);
        bVar2 = std::operator!=(&oldPolicyPath,&realPath);
        if (bVar2) {
          this = status->Makefile;
          cmPolicies::GetPolicyWarning_abi_cxx11_(&local_50,(cmPolicies *)0x98,id);
          cmStrCat<std::__cxx11::string,char_const(&)[21],std::__cxx11::string&,char_const(&)[43],std::__cxx11::string&,char_const(&)[47],std::__cxx11::string&,char_const(&)[81]>
                    (&local_d0,&local_50,(char (*) [21])"\nFrom input path:\n  ",&input,
                     (char (*) [43])"\nthe policy OLD behavior produces path:\n  ",&oldPolicyPath,
                     (char (*) [47])"\nbut the policy NEW behavior produces path:\n  ",&realPath,
                     (char (*) [81])
                     "\nSince the policy is not set, CMake is using the OLD behavior for compatibility."
                    );
          cmMakefile::IssueMessage(this,AUTHOR_WARNING,&local_d0);
          std::__cxx11::string::~string((string *)&local_d0);
          std::__cxx11::string::~string((string *)&local_50);
        }
      }
      std::__cxx11::string::_M_assign((string *)&realPath);
      std::__cxx11::string::~string((string *)&oldPolicyPath);
    }
    value._M_str = realPath._M_dataplus._M_p;
    value._M_len = realPath._M_string_length;
    cmMakefile::AddDefinition
              (status->Makefile,
               (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start + 2,value);
    std::__cxx11::string::~string((string *)&realPath);
    HandleRealPathCommand::Arguments::~Arguments(&computeNewPath.arguments);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&computeNewPath,"REAL_PATH called with unexpected arguments",
               (allocator<char> *)&input);
    std::__cxx11::string::_M_assign((string *)&status->Error);
    this_00 = (value_type *)&computeNewPath;
  }
  std::__cxx11::string::~string((string *)this_00);
LAB_0039c8d4:
  HandleRealPathCommand::Arguments::~Arguments(&arguments);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&unparsedArguments);
  return bVar5;
}

Assistant:

bool HandleRealPathCommand(std::vector<std::string> const& args,
                           cmExecutionStatus& status)
{
  if (args.size() < 3) {
    status.SetError("REAL_PATH requires a path and an output variable");
    return false;
  }

  struct Arguments : public ArgumentParser::ParseResult
  {
    cm::optional<std::string> BaseDirectory;
    bool ExpandTilde = false;
  };
  static auto const parser =
    cmArgumentParser<Arguments>{}
      .Bind("BASE_DIRECTORY"_s, &Arguments::BaseDirectory)
      .Bind("EXPAND_TILDE"_s, &Arguments::ExpandTilde);

  std::vector<std::string> unparsedArguments;
  auto arguments =
    parser.Parse(cmMakeRange(args).advance(3), &unparsedArguments);

  if (!unparsedArguments.empty()) {
    status.SetError("REAL_PATH called with unexpected arguments");
    return false;
  }
  if (arguments.MaybeReportError(status.GetMakefile())) {
    return true;
  }

  if (!arguments.BaseDirectory) {
    arguments.BaseDirectory = status.GetMakefile().GetCurrentSourceDirectory();
  }

  auto input = args[1];
  if (arguments.ExpandTilde && !input.empty()) {
    if (input[0] == '~' && (input.length() == 1 || input[1] == '/')) {
      std::string home;
      if (
#if defined(_WIN32) && !defined(__CYGWIN__)
        cmSystemTools::GetEnv("USERPROFILE", home) ||
#endif
        cmSystemTools::GetEnv("HOME", home)) {
        input.replace(0, 1, home);
      }
    }
  }

  bool warnAbout152 = false;
  bool use152New = true;
  cmPolicies::PolicyStatus policyStatus =
    status.GetMakefile().GetPolicyStatus(cmPolicies::CMP0152);
  switch (policyStatus) {
    case cmPolicies::REQUIRED_IF_USED:
    case cmPolicies::REQUIRED_ALWAYS:
    case cmPolicies::NEW:
      break;
    case cmPolicies::WARN:
      use152New = false;
      warnAbout152 = true;
      break;
    case cmPolicies::OLD:
      use152New = false;
      warnAbout152 = false;
      break;
  }

  auto computeNewPath = [=](std::string const& in, std::string& result) {
    auto path = cmCMakePath{ in };
    if (path.IsRelative()) {
      auto basePath = cmCMakePath{ *arguments.BaseDirectory };
      path = basePath.Append(path);
    }
    result = cmSystemTools::GetActualCaseForPath(
      cmSystemTools::GetRealPath(path.String()));
  };

  std::string realPath;
  if (use152New) {
    computeNewPath(input, realPath);
  } else {
    std::string oldPolicyPath =
      cmSystemTools::CollapseFullPath(input, *arguments.BaseDirectory);
    oldPolicyPath = cmSystemTools::GetRealPath(oldPolicyPath);
    if (warnAbout152) {
      computeNewPath(input, realPath);
      if (oldPolicyPath != realPath) {
        status.GetMakefile().IssueMessage(
          MessageType::AUTHOR_WARNING,
          cmStrCat(cmPolicies::GetPolicyWarning(cmPolicies::CMP0152),
                   "\n"
                   "From input path:\n  ",
                   input, "\nthe policy OLD behavior produces path:\n  ",
                   oldPolicyPath,
                   "\nbut the policy NEW behavior produces path:\n  ",
                   realPath,
                   "\nSince the policy is not set, CMake is using the OLD "
                   "behavior for compatibility."));
      }
    }
    realPath = oldPolicyPath;
  }

  status.GetMakefile().AddDefinition(args[2], realPath);

  return true;
}